

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
CharacterInstance::CharacterInstance
          (CharacterInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *str;
  bool bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Character",&local_39);
  Instance::Instance(&this->super_Instance,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__CharacterInstance_0017be50;
  bVar1 = std::operator==(message_name,"create:withValue:");
  if (!bVar1) {
    bVar1 = std::operator==(message_name,"createIfNotExists:withValue:");
    if (!bVar1) {
      pcVar3 = "RuntimeError: invalid message.";
      goto LAB_001507a2;
    }
  }
  str = (arguments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x40) {
    bVar1 = Grammar::is_variable(str);
    pcVar3 = "RuntimeError: invalid argument.";
    if (bVar1) {
      bVar1 = Grammar::is_character_value
                        ((arguments->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&(this->super_Instance)._name);
        this->_value = (arguments->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p[1];
        return;
      }
    }
  }
  else {
    pcVar3 = "RuntimeError: wrong number of arguments.";
  }
LAB_001507a2:
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

CharacterInstance::CharacterInstance(const std::string& message_name, const std::vector<std::string>& arguments) :
    Instance("Character") {
    if (message_name == "create:withValue:" || message_name == "createIfNotExists:withValue:") {
        if (arguments.size() != 2)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]) || !Grammar::is_character_value(arguments[1]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = arguments[1][1];
    }
    else
        throw EXC_INVALID_MESSAGE;
}